

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Tree::Tree(Tree *this,Tree *that)

{
  pfn_allocate p_Var1;
  pfn_free p_Var2;
  pfn_error p_Var3;
  EVP_PKEY_CTX *in_RDX;
  
  this->m_buf = (NodeData *)0x0;
  this->m_cap = 0;
  this->m_size = 0;
  *(undefined4 *)&this->m_free_head = 0xffffffff;
  *(undefined4 *)((long)&this->m_free_head + 4) = 0xffffffff;
  *(undefined4 *)&this->m_free_tail = 0xffffffff;
  *(undefined4 *)((long)&this->m_free_tail + 4) = 0xffffffff;
  (this->m_arena).str = (char *)0x0;
  (this->m_arena).len = 0;
  this->m_arena_pos = 0;
  p_Var1 = (that->m_callbacks).m_allocate;
  p_Var2 = (that->m_callbacks).m_free;
  p_Var3 = (that->m_callbacks).m_error;
  (this->m_callbacks).m_user_data = (that->m_callbacks).m_user_data;
  (this->m_callbacks).m_allocate = p_Var1;
  (this->m_callbacks).m_free = p_Var2;
  (this->m_callbacks).m_error = p_Var3;
  this->m_tag_directives[0].handle.str = (char *)0x0;
  this->m_tag_directives[0].handle.len = 0;
  this->m_tag_directives[0].prefix.str = (char *)0x0;
  this->m_tag_directives[0].prefix.len = 0;
  this->m_tag_directives[1].handle.str = (char *)0x0;
  this->m_tag_directives[1].handle.len = 0;
  this->m_tag_directives[1].prefix.str = (char *)0x0;
  this->m_tag_directives[1].prefix.len = 0;
  this->m_tag_directives[2].handle.str = (char *)0x0;
  this->m_tag_directives[2].handle.len = 0;
  this->m_tag_directives[2].prefix.str = (char *)0x0;
  this->m_tag_directives[2].prefix.len = 0;
  this->m_tag_directives[3].prefix.str = (char *)0x0;
  this->m_tag_directives[3].prefix.len = 0;
  this->m_tag_directives[3].handle.str = (char *)0x0;
  this->m_tag_directives[3].handle.len = 0;
  _copy(this,(EVP_PKEY_CTX *)that,in_RDX);
  return;
}

Assistant:

Tree::Tree(Tree const& that) noexcept : Tree(that.m_callbacks)
{
    _copy(that);
}